

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putRGBcontig16bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  ushort uVar1;
  ushort *local_38;
  uint16_t *wp;
  uint32_t local_28;
  int samplesperpixel;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  uVar1 = img->samplesperpixel;
  local_38 = (ushort *)pp;
  _y_local = cp;
  for (local_28 = h; w_local = w, local_28 != 0; local_28 = local_28 - 1) {
    for (; w_local != 0; w_local = w_local - 1) {
      *_y_local = CONCAT12(img->Bitdepth16To8[local_38[2]],
                           CONCAT11(img->Bitdepth16To8[local_38[1]],img->Bitdepth16To8[*local_38]))
                  | 0xff000000;
      local_38 = local_38 + (int)(uint)uVar1;
      _y_local = _y_local + 1;
    }
    _y_local = _y_local + toskew;
    local_38 = local_38 + (int)((uint)uVar1 * fromskew);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putRGBcontig16bittile)
{
    int samplesperpixel = img->samplesperpixel;
    uint16_t *wp = (uint16_t *)pp;
    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        for (x = w; x > 0; --x)
        {
            *cp++ = PACK(img->Bitdepth16To8[wp[0]], img->Bitdepth16To8[wp[1]],
                         img->Bitdepth16To8[wp[2]]);
            wp += samplesperpixel;
        }
        cp += toskew;
        wp += fromskew;
    }
}